

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall QFileSystemModelPrivate::rebuildNameFilterRegexps(QFileSystemModelPrivate *this)

{
  back_insert_iterator<std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>_>
  __first;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  CaseSensitivity cs;
  anon_class_4_1_3fcf652e convertWildcardToRegexp;
  Filter in_stack_ffffffffffffff9c;
  qsizetype *this_00;
  anon_class_4_1_3fcf652e __unary_op;
  back_insert_iterator<std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>_>
  __result;
  const_iterator in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffc8;
  vector<QRegularExpression,_std::allocator<QRegularExpression>_> *in_stack_ffffffffffffffd0;
  QFlagsStorageHelper<QDir::Filter,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __result.container =
       (vector<QRegularExpression,_std::allocator<QRegularExpression>_> *)&in_RDI[0xb].d.size;
  std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::clear
            ((vector<QRegularExpression,_std::allocator<QRegularExpression>_> *)0xaa9506);
  this_00 = &in_RDI[10].d.size;
  QList<QString>::size((QList<QString> *)this_00);
  __unary_op.cs = (CaseSensitivity)((ulong)this_00 >> 0x20);
  std::vector<QRegularExpression,_std::allocator<QRegularExpression>_>::reserve
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_c.super_QFlagsStorage<QDir::Filter>.i =
       (QFlagsStorage<QDir::Filter>)
       QFlags<QDir::Filter>::operator&((QFlags<QDir::Filter> *)in_RDI,in_stack_ffffffffffffff9c);
  ::QFlags::operator_cast_to_int((QFlags *)&local_c);
  QList<QString>::constBegin(in_RDI);
  QList<QString>::constEnd(in_RDI);
  __first = std::back_inserter<std::vector<QRegularExpression,std::allocator<QRegularExpression>>>
                      ((vector<QRegularExpression,_std::allocator<QRegularExpression>_> *)in_RDI);
  std::
  transform<QList<QString>::const_iterator,std::back_insert_iterator<std::vector<QRegularExpression,std::allocator<QRegularExpression>>>,QFileSystemModelPrivate::rebuildNameFilterRegexps()::__0>
            ((const_iterator)__first.container,in_stack_ffffffffffffffb8,__result,__unary_op);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::rebuildNameFilterRegexps()
{
    nameFiltersRegexps.clear();
    nameFiltersRegexps.reserve(nameFilters.size());
    const auto cs = (filters & QDir::CaseSensitive) ? Qt::CaseSensitive : Qt::CaseInsensitive;
    const auto convertWildcardToRegexp = [cs](const QString &nameFilter)
    {
        return QRegularExpression::fromWildcard(nameFilter, cs);
    };
    std::transform(nameFilters.constBegin(),
                   nameFilters.constEnd(),
                   std::back_inserter(nameFiltersRegexps),
                   convertWildcardToRegexp);
}